

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O2

bool tcu::isTrilinearCompareValid
               (CompareMode compareMode,TexComparePrecision *prec,Vec4 *depths0,Vec4 *depths1,
               Vec2 *xBounds0,Vec2 *yBounds0,Vec2 *xBounds1,Vec2 *yBounds1,Vec2 *fBounds,
               float cmpReference,float result,bool isFixedPointDepth)

{
  int iVar1;
  CmpResultSet CVar2;
  CmpResultSet CVar3;
  CmpResultSet CVar4;
  CmpResultSet CVar5;
  CmpResultSet CVar6;
  CmpResultSet CVar7;
  CmpResultSet CVar8;
  CmpResultSet CVar9;
  uint uVar10;
  deUint32 comb;
  uint val;
  byte bVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  BVec4 cmpTrue1;
  BVec4 cmpTrue0;
  Vec4 refVal1;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  Vec4 refVal0;
  
  iVar1 = *(int *)(prec + 0x18);
  CVar2 = execCompare(compareMode,depths0->m_data[0],cmpReference,*(int *)(prec + 0x1c),
                      isFixedPointDepth);
  CVar3 = execCompare(compareMode,depths0->m_data[1],cmpReference,*(int *)(prec + 0x1c),
                      isFixedPointDepth);
  CVar4 = execCompare(compareMode,depths0->m_data[2],cmpReference,*(int *)(prec + 0x1c),
                      isFixedPointDepth);
  CVar5 = execCompare(compareMode,depths0->m_data[3],cmpReference,*(int *)(prec + 0x1c),
                      isFixedPointDepth);
  CVar6 = execCompare(compareMode,depths1->m_data[0],cmpReference,*(int *)(prec + 0x1c),
                      isFixedPointDepth);
  CVar7 = execCompare(compareMode,depths1->m_data[1],cmpReference,*(int *)(prec + 0x1c),
                      isFixedPointDepth);
  CVar8 = execCompare(compareMode,depths1->m_data[2],cmpReference,*(int *)(prec + 0x1c),
                      isFixedPointDepth);
  CVar9 = execCompare(compareMode,depths1->m_data[3],cmpReference,*(int *)(prec + 0x1c),
                      isFixedPointDepth);
  if (iVar1 < 1) {
    fVar13 = 1.0;
    if (((((((ushort)CVar2 & 1) == 0) && (((ushort)CVar3 & 1) == 0)) && (((ushort)CVar4 & 1) == 0))
        && ((((ushort)CVar5 & 1) == 0 && (((ushort)CVar6 & 1) == 0)))) &&
       ((((ushort)CVar7 & 1) == 0 && (((ushort)CVar8 & 1) == 0)))) {
      if (((ushort)CVar9 & 1) == 0) {
        fVar13 = 0.0;
      }
      else {
        fVar13 = 1.0;
      }
    }
    fVar14 = 0.0;
    if ((((((ushort)CVar6 | (ushort)CVar7) >> 8 & 1) == 0 && ((ushort)CVar8 >> 8 & 1) == 0) &&
         (CONCAT26(CVar5,CONCAT24(CVar4,CONCAT22(CVar3,CVar2))) & (ulong)DAT_00608ba0) == 0) &&
       (((ushort)CVar9 >> 8 & 1) == 0)) {
      fVar14 = 1.0;
    }
    fVar23 = TexVerifierUtil::computeFixedPointError(*(int *)(prec + 0x20));
    bVar11 = -(result <= fVar13 + fVar23) & -(fVar14 - fVar23 <= result);
  }
  else {
    fVar13 = TexVerifierUtil::computeFixedPointError(*(int *)(prec + 0x18));
    fVar14 = TexVerifierUtil::computeFixedPointError(*(int *)(prec + 0x20));
    uVar10 = 0xffffffff;
    for (val = 0; val != 0x100; val = val + 1) {
      if ((uVar10 & ((ushort)CVar9 >> 1 & 0x80 |
                    (ushort)CVar8 >> 2 & 0x40 |
                    (ushort)CVar7 >> 3 & 0x20 |
                    (ushort)CVar6 >> 4 & 0x10 |
                    (ushort)CVar5 >> 5 & 8 |
                    (ushort)CVar4 >> 6 & 4 | (ushort)CVar3 >> 7 & 2 | (ushort)CVar2 >> 8 & 1) |
          val & (((ushort)CVar9 & 1) << 7 |
                ((ushort)CVar8 & 1) << 6 |
                ((ushort)CVar7 & 1) << 5 |
                ((ushort)CVar6 & 1) << 4 |
                ((ushort)CVar2 & 1) + ((ushort)CVar3 & 1) * 2 + ((ushort)CVar4 & 1) * 4 +
                ((ushort)CVar5 & 1) * 8)) == 0xff) {
        extractBVec4(val,0);
        extractBVec4(val,4);
        Vector<float,_4>::Vector((Vector<float,_4> *)&refVal1,1.0);
        Vector<float,_4>::Vector(&local_50,0.0);
        select<float,4>((tcu *)&refVal0,(Vector<float,_4> *)&refVal1,&local_50,&cmpTrue0);
        Vector<float,_4>::Vector(&local_50,1.0);
        Vector<float,_4>::Vector(&local_60,0.0);
        select<float,4>((tcu *)&refVal1,&local_50,&local_60,&cmpTrue1);
        fVar23 = xBounds0->m_data[0];
        fVar25 = yBounds0->m_data[0];
        fVar15 = bilinearInterpolate(&refVal0,fVar23,fVar25);
        fVar22 = xBounds0->m_data[1];
        fVar16 = bilinearInterpolate(&refVal0,fVar22,fVar25);
        fVar25 = yBounds0->m_data[1];
        fVar17 = bilinearInterpolate(&refVal0,fVar23,fVar25);
        fVar18 = bilinearInterpolate(&refVal0,fVar22,fVar25);
        fVar23 = (float)(~-(uint)(fVar17 <= fVar18) & (uint)fVar18 |
                        -(uint)(fVar17 <= fVar18) & (uint)fVar17);
        uVar12 = -(uint)(fVar16 <= fVar23);
        fVar23 = (float)(uVar12 & (uint)fVar16 | ~uVar12 & (uint)fVar23);
        uVar12 = -(uint)(fVar15 <= fVar23);
        fVar27 = (float)(uVar12 & (uint)fVar15 | ~uVar12 & (uint)fVar23);
        fVar23 = xBounds1->m_data[0];
        fVar25 = yBounds1->m_data[0];
        fVar19 = bilinearInterpolate(&refVal1,fVar23,fVar25);
        fVar22 = xBounds1->m_data[1];
        fVar20 = bilinearInterpolate(&refVal1,fVar22,fVar25);
        fVar25 = yBounds1->m_data[1];
        fVar21 = bilinearInterpolate(&refVal1,fVar23,fVar25);
        fVar22 = bilinearInterpolate(&refVal1,fVar22,fVar25);
        fVar23 = (float)(~-(uint)(fVar21 <= fVar22) & (uint)fVar22 |
                        -(uint)(fVar21 <= fVar22) & (uint)fVar21);
        uVar12 = -(uint)(fVar20 <= fVar23);
        fVar23 = (float)(uVar12 & (uint)fVar20 | ~uVar12 & (uint)fVar23);
        uVar12 = -(uint)(fVar19 <= fVar23);
        fVar24 = (float)(uVar12 & (uint)fVar19 | ~uVar12 & (uint)fVar23);
        fVar23 = fBounds->m_data[0];
        fVar25 = fBounds->m_data[1];
        fVar26 = fVar27 * (1.0 - fVar23) + fVar24 * fVar23;
        fVar27 = fVar27 * (1.0 - fVar25) + fVar24 * fVar25;
        uVar12 = -(uint)(fVar26 <= fVar27);
        if ((float)(~uVar12 & (uint)fVar27 | (uint)fVar26 & uVar12) - (fVar14 + fVar13) <= result) {
          fVar17 = (float)(~-(uint)(fVar18 <= fVar17) & (uint)fVar18 |
                          (uint)fVar17 & -(uint)(fVar18 <= fVar17));
          uVar12 = -(uint)(fVar17 <= fVar16);
          fVar16 = (float)(uVar12 & (uint)fVar16 | ~uVar12 & (uint)fVar17);
          uVar12 = -(uint)(fVar16 <= fVar15);
          fVar15 = (float)(uVar12 & (uint)fVar15 | ~uVar12 & (uint)fVar16);
          fVar22 = (float)(~-(uint)(fVar22 <= fVar21) & (uint)fVar22 |
                          (uint)fVar21 & -(uint)(fVar22 <= fVar21));
          uVar12 = -(uint)(fVar22 <= fVar20);
          fVar22 = (float)(uVar12 & (uint)fVar20 | ~uVar12 & (uint)fVar22);
          uVar12 = -(uint)(fVar22 <= fVar19);
          fVar22 = (float)(uVar12 & (uint)fVar19 | ~uVar12 & (uint)fVar22);
          fVar23 = fVar15 * (1.0 - fVar23) + fVar23 * fVar22;
          fVar25 = fVar15 * (1.0 - fVar25) + fVar25 * fVar22;
          uVar12 = -(uint)(fVar25 <= fVar23);
          if (result <= (float)(~uVar12 & (uint)fVar25 | (uint)fVar23 & uVar12) + fVar14 + fVar13)
          break;
        }
      }
      uVar10 = uVar10 - 1;
    }
    bVar11 = val < 0x100;
  }
  return (bool)(bVar11 & 1);
}

Assistant:

static bool isTrilinearCompareValid (const Sampler::CompareMode	compareMode,
									 const TexComparePrecision&	prec,
									 const Vec4&				depths0,
									 const Vec4&				depths1,
									 const Vec2&				xBounds0,
									 const Vec2&				yBounds0,
									 const Vec2&				xBounds1,
									 const Vec2&				yBounds1,
									 const Vec2&				fBounds,
									 const float				cmpReference,
									 const float				result,
									 const bool					isFixedPointDepth)
{
	if (prec.pcfBits > 0)
		return isTrilinearPCFCompareValid(compareMode, prec, depths0, depths1, xBounds0, yBounds0, xBounds1, yBounds1, fBounds, cmpReference, result, isFixedPointDepth);
	else
		return isTrilinearAnyCompareValid(compareMode, prec, depths0, depths1, cmpReference, result, isFixedPointDepth);
}